

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::dropEvent(QGraphicsScene *this,QGraphicsSceneDragDropEvent *event)

{
  QGraphicsScenePrivate *pQVar1;
  QGraphicsSceneDragDropEvent *in_RDI;
  QGraphicsScenePrivate *d;
  
  pQVar1 = d_func((QGraphicsScene *)0x9d228c);
  if (pQVar1->dragDropItem != (QGraphicsItem *)0x0) {
    QGraphicsScenePrivate::sendDragDropEvent
              ((QGraphicsScenePrivate *)event,(QGraphicsItem *)d,in_RDI);
    pQVar1->dragDropItem = (QGraphicsItem *)0x0;
  }
  return;
}

Assistant:

void QGraphicsScene::dropEvent(QGraphicsSceneDragDropEvent *event)
{
    Q_UNUSED(event);
    Q_D(QGraphicsScene);
    if (d->dragDropItem) {
        // Drop on the last drag drop item
        d->sendDragDropEvent(d->dragDropItem, event);
        d->dragDropItem = nullptr;
    }
}